

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPartHelper.cpp
# Opt level: O1

void (anonymous_namespace)::
     print<__gnu_cxx::__normal_iterator<Imf_3_4::MultiViewChannelName*,std::vector<Imf_3_4::MultiViewChannelName,std::allocator<Imf_3_4::MultiViewChannelName>>>>
               (__normal_iterator<Imf_3_4::MultiViewChannelName_*,_std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>_>
                *begin,__normal_iterator<Imf_3_4::MultiViewChannelName_*,_std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>_>
                       *end)

{
  ostream *poVar1;
  int p;
  int iVar2;
  MultiViewChannelName *pMVar3;
  char local_3f [3];
  int local_3c;
  __normal_iterator<Imf_3_4::MultiViewChannelName_*,_std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>_>
  *local_38;
  
  local_3c = 1;
  for (pMVar3 = begin->_M_current; end->_M_current != pMVar3; pMVar3 = pMVar3 + 1) {
    if (local_3c < pMVar3->part_number) {
      local_3c = pMVar3->part_number;
    }
  }
  iVar2 = 0;
  local_38 = begin;
  do {
    pMVar3 = local_38->_M_current;
    if (end->_M_current != pMVar3) {
      do {
        if (pMVar3->part_number == iVar2) {
          poVar1 = (ostream *)std::ostream::operator<<(&std::cout,pMVar3->part_number);
          local_3f[0] = ' ';
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3f,1);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar1,(pMVar3->name)._M_dataplus._M_p,(pMVar3->name)._M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," in ",4);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar1,(pMVar3->view)._M_dataplus._M_p,(pMVar3->view)._M_string_length
                             );
          local_3f[1] = 0x20;
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3f + 1,1);
          local_3f[2] = 0x20;
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3f + 2,1);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar1,(pMVar3->internal_name)._M_dataplus._M_p,
                              (pMVar3->internal_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
        }
        pMVar3 = pMVar3 + 1;
      } while (pMVar3 != end->_M_current);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != local_3c);
  return;
}

Assistant:

void
print (const T& begin, const T& end)
{
    int parts = 1;
    for (T i = begin; i != end; i++)
    {
        parts = max (i->part_number, parts);
    }

    for (int p = 0; p < parts; p++)
    {
        for (T i = begin; i != end; i++)
        {
            if (i->part_number == p)
            {
                cout << i->part_number << ' ' << i->name << " in " << i->view
                     << ' ' << ' ' << i->internal_name << "\n";
            }
        }
    }
}